

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

bool __thiscall wallet::CWallet::TransactionCanBeAbandoned(CWallet *this,uint256 *hashTx)

{
  bool bVar1;
  int iVar2;
  const_iterator cVar3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock23;
  unique_lock<std::recursive_mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device = &(this->cs_wallet).super_recursive_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_28);
  cVar3 = std::
          _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->mapWallet)._M_h,hashTx);
  if ((cVar3.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur !=
       (__node_type *)0x0) &&
     ((*(char *)((long)cVar3.
                       super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                       _M_cur + 0x1f8) != '\x03' ||
      ((*(byte *)((long)cVar3.
                        super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                        ._M_cur + 0x1d0) & 1) == 0)))) {
    iVar2 = GetTxDepthInMainChain
                      (this,(CWalletTx *)
                            ((long)cVar3.
                                   super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                   ._M_cur + 0x28));
    if (iVar2 == 0) {
      bVar1 = CWalletTx::InMempool
                        ((CWalletTx *)
                         ((long)cVar3.
                                super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                ._M_cur + 0x28));
      bVar1 = !bVar1;
      goto LAB_00c2cf07;
    }
  }
  bVar1 = false;
LAB_00c2cf07:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::TransactionCanBeAbandoned(const uint256& hashTx) const
{
    LOCK(cs_wallet);
    const CWalletTx* wtx = GetWalletTx(hashTx);
    return wtx && !wtx->isAbandoned() && GetTxDepthInMainChain(*wtx) == 0 && !wtx->InMempool();
}